

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

Symbol * elf_pltgotentry(GlobalVars *gv,Section *sec,DynArg a,uint8_t entrysymtype,
                        unsigned_long offsadd,unsigned_long sizeadd,int etype,bool relaflag,
                        size_t relocsize,size_t addrsize)

{
  lword addend;
  Section *rs;
  char *name;
  Symbol *pSVar1;
  Reloc *r;
  char entryname [256];
  
  addend = *(lword *)(a.name + (ulong)(etype != 4) * 0x10 + 0x20);
  rs = *(Section **)(a.name + (ulong)(etype != 4) * 0x20 + 0x18);
  snprintf(entryname,0x100," %s@%lx@%lx",sec->name,rs);
  name = allocstring(entryname);
  pSVar1 = addsymbol(gv,sec,name,(char *)0x0,sec->offset,'\x02','\0',entrysymtype,'\x01',
                     (uint32_t)offsadd,0);
  if (pSVar1 == (Symbol *)0x0) {
    pSVar1 = findlocsymbol(gv,sec->obj,entryname);
    if (pSVar1 == (Symbol *)0x0) {
      ierror("%s %s-symbol refering to %s+%lx disappeared","elf_pltgotentry():",sec->name,rs->name);
    }
    if (etype == 4) {
      r = newreloc(gv,sec,(char *)0x0,rs,0,sec->offset,'\x01',addend);
    }
    else {
      r = newreloc(gv,sec,(a.sym)->name,(Section *)0x0,0,sec->offset,""[etype],0);
      r->relocsect = (anon_union_8_4_462a49d9_for_relocsect)a;
    }
    addreloc(sec,r,0,(uint16_t)addrsize,-1);
    elf_dynreloc(gv->dynobj,r,relaflag,relocsize);
    sec->offset = sec->offset + offsadd;
    sec->size = sec->size + sizeadd;
  }
  return pSVar1;
}

Assistant:

struct Symbol *elf_pltgotentry(struct GlobalVars *gv,struct Section *sec,
                               DynArg a,uint8_t entrysymtype,
                               unsigned long offsadd,unsigned long sizeadd,
                               int etype,bool relaflag,
                               size_t relocsize,size_t addrsize)
/* Make a table entry for indirectly accessing a location from an external
   symbol defintion (GOT_ENTRY/PLT_ENTRY) or a local relocation (GOT_LOCAL).
   The entry has a size of offsadd bytes, while the table section sec will
   become sizeadd bytes larger per entry. */
{
  const char *fn = "elf_pltgotentry():";
  char entryname[MAXLEN];
  struct Symbol *tabsym;
  struct Section *refsec;
  unsigned long refoffs;

  /* determine reference section and offset of ext. symbol or local reloc */
  if (etype == GOT_LOCAL) {
    refsec = a.rel->relocsect.ptr;
    refoffs = a.rel->offset;
  }
  else {
    refsec = a.sym->relsect;
    refoffs = (unsigned long)a.sym->value;
  }

  /* generate internal symbol name for this reference */
  snprintf(entryname,MAXLEN," %s@%lx@%lx",
           sec->name,(unsigned long)refsec,refoffs);

  /* create internal symbol, or return old one, when already present */
  tabsym = addsymbol(gv,sec,allocstring(entryname),NULL,(lword)sec->offset,
                     SYM_RELOC,0,entrysymtype,SYMB_LOCAL,offsadd,FALSE);

  /* tabsym is NULL when it was just created, otherwise we already got it */
  if (tabsym == NULL) {
    static uint8_t dyn_reloc_types[] = { R_NONE,R_GLOBDAT,R_JMPSLOT,R_COPY };
    struct Reloc *r;
    uint8_t rtype;

    tabsym = findlocsymbol(gv,sec->obj,entryname);
    if (tabsym == NULL) {
      ierror("%s %s-symbol refering to %s+%lx disappeared",
             fn,sec->name,refsec->name,refoffs);
    }

    /* create a relocation for the new entry */
    if (etype == GOT_LOCAL) {
      /* local symbol: GOT relocation can be resolved now */
      r = newreloc(gv,sec,NULL,refsec,0,sec->offset,R_ABS,(lword)refoffs);
    }
    else {
      /* we need a dynamic linker relocation at the entry's offset */
      r = newreloc(gv,sec,a.sym->name,NULL,0,sec->offset,
                   dyn_reloc_types[etype],0);
      r->relocsect.symbol = a.sym;  /* resolve with external symbol */
      /* Possible enhancement: Find out whether referenced symbol resides
         in an uninitialized section, without a relocation, then we don't
         need an R_COPY relocation either! */
    }
    addreloc(sec,r,0,addrsize,-1);  /* size,mask only important for R_ABS */
    elf_dynreloc(gv->dynobj,r,relaflag,relocsize);

    /* increase offset and size counters of table-section */
    sec->offset += offsadd;
    sec->size += sizeadd;
  }

  return tabsym;
}